

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O0

faup_snapshot_value_count_t * faup_snapshot_value_count_new(void)

{
  faup_snapshot_value_count_t *vc;
  
  vc = (faup_snapshot_value_count_t *)malloc(0x20);
  if (vc == (faup_snapshot_value_count_t *)0x0) {
    fprintf(_stderr,"Error: cannot allocate faup_snapshot_value_count_t\n");
    vc = (faup_snapshot_value_count_t *)0x0;
  }
  else {
    vc->value = (char *)0x0;
    vc->first_time_seen = 0;
    vc->last_time_seen = 0;
    vc->count = 0;
  }
  return vc;
}

Assistant:

faup_snapshot_value_count_t *faup_snapshot_value_count_new(void)
{
  faup_snapshot_value_count_t *vc;

  vc = malloc(sizeof(faup_snapshot_value_count_t));
  if (!vc) {
    fprintf(stderr, "Error: cannot allocate faup_snapshot_value_count_t\n");
    return NULL;
  }
  vc->value = NULL;
  vc->first_time_seen = 0;
  vc->last_time_seen = 0;
  vc->count = 0;

  return vc;
}